

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3DeferredToken *pFVar1;
  int iVar2;
  int iVar3;
  char *__dest;
  char *pcVar4;
  Fts3Expr *pFVar5;
  Fts3Expr *pFVar6;
  uint uVar7;
  long lVar8;
  Fts3Expr *pFVar9;
  Fts3DeferredToken **ppFVar10;
  char *pcVar11;
  uint uVar12;
  size_t __n;
  Fts3Phrase *pFVar13;
  Fts3Expr *p;
  long in_FS_OFFSET;
  char *p2;
  char *p1;
  char *aPoslist;
  char *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = 1;
  if (*pRc != 0) goto LAB_001cd757;
  switch(pExpr->eType) {
  case 1:
  case 3:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if ((iVar3 != 0) && (iVar3 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc), iVar3 != 0)) {
      if (((*pRc != 0) || (pExpr->eType != 1)) ||
         ((pExpr->pParent != (Fts3Expr *)0x0 && (pExpr->pParent->eType == 1)))) goto LAB_001cd757;
      if (pExpr->pLeft == (Fts3Expr *)0x0) {
        lVar8 = 0;
        pFVar9 = pExpr;
      }
      else {
        lVar8 = 0;
        pFVar5 = pExpr->pLeft;
        pFVar6 = pExpr;
        do {
          pFVar9 = pFVar5;
          lVar8 = lVar8 + (pFVar6->pRight->pPhrase->doclist).nList;
          pFVar5 = pFVar9->pLeft;
          pFVar6 = pFVar9;
        } while (pFVar9->pLeft != (Fts3Expr *)0x0);
      }
      iVar3 = (pFVar9->pPhrase->doclist).nList;
      iVar2 = sqlite3_initialize();
      if ((iVar2 == 0) &&
         (pcVar4 = (char *)sqlite3Malloc((lVar8 + iVar3) * 2 + 10), pcVar4 != (char *)0x0)) {
        local_40 = (pFVar9->pPhrase->doclist).pList;
        local_48 = (char *)CONCAT44(local_48._4_4_,pFVar9->pPhrase->nToken);
        pFVar9 = pFVar9->pParent;
        if (pFVar9 == (Fts3Expr *)0x0) {
LAB_001cdc9f:
          iVar3 = 1;
        }
        else {
          do {
            if (pFVar9->eType != 1) goto LAB_001cdc9f;
            iVar3 = fts3EvalNearTrim(pFVar9->nNear,pcVar4,&local_40,(int *)&local_48,
                                     pFVar9->pRight->pPhrase);
          } while ((iVar3 != 0) && (pFVar9 = pFVar9->pParent, pFVar9 != (Fts3Expr *)0x0));
        }
        pFVar13 = pExpr->pRight->pPhrase;
        local_40 = (pFVar13->doclist).pList;
        local_48 = (char *)CONCAT44(local_48._4_4_,pFVar13->nToken);
        pFVar9 = pExpr->pLeft;
        if (iVar3 != 0 && pFVar9 != (Fts3Expr *)0x0) {
          do {
            pFVar5 = pFVar9;
            if (pFVar9->eType == 1) {
              pFVar5 = pFVar9->pRight;
            }
            iVar3 = fts3EvalNearTrim(pFVar9->pParent->nNear,pcVar4,&local_40,(int *)&local_48,
                                     pFVar5->pPhrase);
            pFVar9 = pFVar9->pLeft;
          } while ((pFVar9 != (Fts3Expr *)0x0) && (iVar3 != 0));
        }
        sqlite3_free(pcVar4);
        if (iVar3 != 0) goto LAB_001cd757;
      }
      else {
        *pRc = 7;
      }
    }
    if ((pExpr->eType == 1) && ((pExpr->pParent == (Fts3Expr *)0x0 || (pExpr->pParent->eType != 1)))
       ) {
      pFVar13 = pExpr->pPhrase;
      while (pFVar13 == (Fts3Phrase *)0x0) {
        if (pExpr->pRight->iDocid == pCsr->iPrevId) {
          pFVar13 = pExpr->pRight->pPhrase;
          if ((pFVar13->doclist).bFreeList != 0) {
            sqlite3_free((pFVar13->doclist).pList);
          }
          (pFVar13->doclist).pList = (char *)0x0;
          (pFVar13->doclist).nList = 0;
          (pFVar13->doclist).bFreeList = 0;
        }
        pExpr = pExpr->pLeft;
        pFVar13 = pExpr->pPhrase;
      }
      if (pExpr->iDocid == pCsr->iPrevId) {
        if ((pFVar13->doclist).bFreeList != 0) {
          sqlite3_free((pFVar13->doclist).pList);
        }
        (pFVar13->doclist).pList = (char *)0x0;
        uVar12 = 0;
        (pFVar13->doclist).nList = 0;
        (pFVar13->doclist).bFreeList = 0;
        goto LAB_001cd757;
      }
    }
    break;
  case 2:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if (iVar3 != 0) {
      iVar3 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
      uVar12 = (uint)(iVar3 == 0);
      goto LAB_001cd757;
    }
    break;
  case 4:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    iVar2 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    uVar12 = (uint)(iVar2 != 0 || iVar3 != 0);
    goto LAB_001cd757;
  default:
    if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
      if (pExpr->bDeferred != '\0') {
        pFVar13 = pExpr->pPhrase;
        if ((pFVar13->doclist).bFreeList != 0) {
          sqlite3_free((pFVar13->doclist).pList);
        }
        (pFVar13->doclist).pList = (char *)0x0;
        (pFVar13->doclist).nList = 0;
        (pFVar13->doclist).bFreeList = 0;
        pcVar4 = (char *)0x0;
LAB_001cd8db:
        if (pFVar13->nToken < 1) {
LAB_001cdd53:
          iVar3 = 0;
          if ((pFVar13->doclist).pList != pcVar4) {
            sqlite3_free(pcVar4);
          }
        }
        else {
          ppFVar10 = &pFVar13->aToken[0].pDeferred;
          uVar12 = 0xffffffff;
          lVar8 = 0;
          __n = 0;
          pcVar11 = (char *)0x0;
          do {
            pFVar1 = *ppFVar10;
            __dest = pcVar11;
            uVar7 = uVar12;
            if (pFVar1 != (Fts3DeferredToken *)0x0) {
              if (pFVar1->pList == (PendingList *)0x0) {
                sqlite3_free(pcVar11);
                sqlite3_free(pcVar4);
LAB_001cdc66:
                (pFVar13->doclist).pList = (char *)0x0;
                (pFVar13->doclist).nList = 0;
                iVar3 = 0;
                goto LAB_001cdd68;
              }
              iVar3 = pFVar1->pList->nData;
              iVar2 = sqlite3_initialize();
              if ((iVar2 != 0) ||
                 (__dest = (char *)sqlite3Malloc((long)iVar3), __dest == (char *)0x0)) {
                iVar3 = 7;
                goto LAB_001cdd68;
              }
              iVar3 = sqlite3Fts3GetVarintU(pFVar1->pList->aData,(sqlite_uint64 *)&local_40);
              __n = (long)pFVar1->pList->nData - (long)iVar3;
              memcpy(__dest,pFVar1->pList->aData + iVar3,__n);
              uVar7 = (uint)lVar8;
              if (pcVar11 != (char *)0x0) {
                local_50 = __dest;
                local_48 = pcVar11;
                local_40 = __dest;
                fts3PoslistPhraseMerge(&local_40,uVar7 - uVar12,0,1,&local_48,&local_50);
                sqlite3_free(pcVar11);
                uVar12 = (int)local_40 - (int)__dest;
                __n = (size_t)uVar12;
                if (uVar12 == 0) {
                  sqlite3_free(__dest);
                  sqlite3_free(pcVar4);
                  goto LAB_001cdc66;
                }
              }
            }
            uVar12 = uVar7;
            lVar8 = lVar8 + 1;
            ppFVar10 = ppFVar10 + 5;
            pcVar11 = __dest;
          } while (lVar8 < pFVar13->nToken);
          if ((int)uVar12 < 0) goto LAB_001cdd53;
          uVar7 = pFVar13->iDoclistToken;
          if ((int)uVar7 < 0) {
            (pFVar13->doclist).pList = __dest;
            (pFVar13->doclist).nList = (int)__n;
            (pFVar13->doclist).iDocid = pCsr->iPrevId;
            (pFVar13->doclist).bFreeList = 1;
            goto LAB_001cdd53;
          }
          pcVar11 = (pFVar13->doclist).pList;
          local_48 = pcVar11;
          local_40 = __dest;
          if (uVar7 <= uVar12) {
            local_48 = __dest;
            local_40 = pcVar11;
          }
          local_50 = (char *)sqlite3Fts3MallocZero((long)((int)__n + 8));
          if (local_50 != (char *)0x0) {
            iVar3 = uVar12 - uVar7;
            if (uVar12 < uVar7) {
              iVar3 = -(uVar12 - uVar7);
            }
            (pFVar13->doclist).pList = local_50;
            iVar2 = 0;
            iVar3 = fts3PoslistPhraseMerge(&local_50,iVar3,0,1,&local_40,&local_48);
            if (iVar3 == 0) {
              sqlite3_free(local_50);
              (pFVar13->doclist).pList = (char *)0x0;
            }
            else {
              (pFVar13->doclist).bFreeList = 1;
              iVar2 = (int)local_50 - *(int *)&(pFVar13->doclist).pList;
            }
            (pFVar13->doclist).nList = iVar2;
            sqlite3_free(__dest);
            goto LAB_001cdd53;
          }
          sqlite3_free(__dest);
          iVar3 = 7;
        }
LAB_001cdd68:
        *pRc = iVar3;
        uVar12 = (uint)((pFVar13->doclist).pList != (char *)0x0);
        pExpr->iDocid = pCsr->iPrevId;
        goto LAB_001cd757;
      }
      if (pExpr->iDocid == pCsr->iPrevId) {
        pFVar13 = pExpr->pPhrase;
        pcVar4 = (pFVar13->doclist).pList;
        if (pcVar4 != (char *)0x0) {
          if ((pFVar13->doclist).bFreeList == 0) {
            pcVar4 = (char *)0x0;
          }
          goto LAB_001cd8db;
        }
      }
    }
    if ((pExpr->bEof == '\0') && (pExpr->iDocid == pCsr->iPrevId)) {
      uVar12 = (uint)(0 < (pExpr->pPhrase->doclist).nList);
      goto LAB_001cd757;
    }
  }
  uVar12 = 0;
LAB_001cd757:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar12;
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize
        ** any instances of phrases that are part of unmatched NEAR queries.
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0
         && pExpr->eType==FTSQUERY_NEAR
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred && (pExpr->bDeferred || (
            pExpr->iDocid==pCsr->iPrevId && pExpr->pPhrase->doclist.pList
        ))){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (
              pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId
           && pExpr->pPhrase->doclist.nList>0
          );
        }
        break;
      }
    }
  }
  return bHit;
}